

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

size_t __thiscall CoreML::Specification::Model::ByteSizeLong(Model *this)

{
  uint32 uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (this->description_ == (ModelDescription *)0x0 || this == (Model *)&_Model_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = ModelDescription::ByteSizeLong(this->description_);
    uVar4 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 1;
  }
  uVar4 = this->specificationversion_;
  if (uVar4 != 0) {
    if ((int)uVar4 < 0) {
      uVar5 = 0xb;
    }
    else {
      iVar2 = 0x1f;
      if ((uVar4 | 1) != 0) {
        for (; (uVar4 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar5 = (ulong)((iVar2 * 9 + 0x49U >> 6) + 1);
    }
    sVar3 = sVar3 + uVar5;
  }
  sVar6 = sVar3 + 2;
  if (this->isupdatable_ == false) {
    sVar6 = sVar3;
  }
  uVar1 = this->_oneof_case_[0];
  if ((int)uVar1 < 600) {
    if ((int)uVar1 < 400) {
      if ((int)uVar1 < 300) {
        if (uVar1 == 200) {
          sVar3 = PipelineClassifier::ByteSizeLong((this->Type_).pipelineclassifier_);
        }
        else if (uVar1 == 0xc9) {
          sVar3 = PipelineRegressor::ByteSizeLong((this->Type_).pipelineregressor_);
        }
        else {
          if (uVar1 != 0xca) goto switchD_001d6816_default;
          sVar3 = Pipeline::ByteSizeLong((this->Type_).pipeline_);
        }
      }
      else {
        switch(uVar1) {
        case 300:
          sVar3 = GLMRegressor::ByteSizeLong((this->Type_).glmregressor_);
          break;
        case 0x12d:
          sVar3 = SupportVectorRegressor::ByteSizeLong((this->Type_).supportvectorregressor_);
          break;
        case 0x12e:
          sVar3 = TreeEnsembleRegressor::ByteSizeLong((this->Type_).treeensembleregressor_);
          break;
        case 0x12f:
          sVar3 = NeuralNetworkRegressor::ByteSizeLong((this->Type_).neuralnetworkregressor_);
          break;
        case 0x130:
          sVar3 = BayesianProbitRegressor::ByteSizeLong((this->Type_).bayesianprobitregressor_);
          break;
        default:
          goto switchD_001d6816_default;
        }
      }
    }
    else if ((int)uVar1 < 500) {
      switch(uVar1) {
      case 400:
        sVar3 = GLMClassifier::ByteSizeLong((this->Type_).glmclassifier_);
        break;
      case 0x191:
        sVar3 = SupportVectorClassifier::ByteSizeLong((this->Type_).supportvectorclassifier_);
        break;
      case 0x192:
        sVar3 = TreeEnsembleClassifier::ByteSizeLong((this->Type_).treeensembleclassifier_);
        break;
      case 0x193:
        sVar3 = NeuralNetworkClassifier::ByteSizeLong((this->Type_).neuralnetworkclassifier_);
        break;
      case 0x194:
        sVar3 = KNearestNeighborsClassifier::ByteSizeLong
                          ((this->Type_).knearestneighborsclassifier_);
        break;
      default:
        goto switchD_001d6816_default;
      }
    }
    else if ((int)uVar1 < 0x22b) {
      if (uVar1 == 500) {
        sVar3 = NeuralNetwork::ByteSizeLong((this->Type_).neuralnetwork_);
      }
      else {
        if (uVar1 != 0x1f5) goto switchD_001d6816_default;
        sVar3 = ItemSimilarityRecommender::ByteSizeLong((this->Type_).itemsimilarityrecommender_);
      }
    }
    else if (uVar1 == 0x22b) {
      sVar3 = CustomModel::ByteSizeLong((this->Type_).custommodel_);
    }
    else {
      if (uVar1 != 0x22c) goto switchD_001d6816_default;
      sVar3 = LinkedModel::ByteSizeLong((this->Type_).linkedmodel_);
    }
  }
  else if ((int)uVar1 < 900) {
    switch(uVar1) {
    case 600:
      sVar3 = OneHotEncoder::ByteSizeLong((this->Type_).onehotencoder_);
      break;
    case 0x259:
      sVar3 = Imputer::ByteSizeLong((this->Type_).imputer_);
      break;
    case 0x25a:
      sVar3 = FeatureVectorizer::ByteSizeLong((this->Type_).featurevectorizer_);
      break;
    case 0x25b:
      sVar3 = DictVectorizer::ByteSizeLong((this->Type_).dictvectorizer_);
      break;
    case 0x25c:
      sVar3 = Scaler::ByteSizeLong((this->Type_).scaler_);
      break;
    default:
      goto switchD_001d6816_default;
    case 0x25e:
      sVar3 = CategoricalMapping::ByteSizeLong((this->Type_).categoricalmapping_);
      break;
    case 0x25f:
      sVar3 = Normalizer::ByteSizeLong((this->Type_).normalizer_);
      break;
    case 0x261:
      sVar3 = ArrayFeatureExtractor::ByteSizeLong((this->Type_).arrayfeatureextractor_);
      break;
    case 0x262:
      sVar3 = NonMaximumSuppression::ByteSizeLong((this->Type_).nonmaximumsuppression_);
    }
  }
  else {
    switch(uVar1) {
    case 2000:
      sVar3 = CoreMLModels::TextClassifier::ByteSizeLong((this->Type_).textclassifier_);
      break;
    case 0x7d1:
      sVar3 = CoreMLModels::WordTagger::ByteSizeLong((this->Type_).wordtagger_);
      break;
    case 0x7d2:
      sVar3 = CoreMLModels::VisionFeaturePrint::ByteSizeLong((this->Type_).visionfeatureprint_);
      break;
    case 0x7d3:
      sVar3 = CoreMLModels::SoundAnalysisPreprocessing::ByteSizeLong
                        ((this->Type_).soundanalysispreprocessing_);
      break;
    case 0x7d4:
      sVar3 = CoreMLModels::Gazetteer::ByteSizeLong((this->Type_).gazetteer_);
      break;
    case 0x7d5:
      sVar3 = CoreMLModels::WordEmbedding::ByteSizeLong((this->Type_).wordembedding_);
      break;
    default:
      if (uVar1 != 900) {
        if (uVar1 == 3000) {
          sVar3 = SerializedModel::ByteSizeLong((this->Type_).serializedmodel_);
          uVar4 = (uint)sVar3 | 1;
          iVar2 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
            }
          }
          sVar6 = sVar6 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 3;
        }
        goto switchD_001d6816_default;
      }
      sVar3 = Identity::ByteSizeLong((this->Type_).identity_);
    }
  }
  uVar4 = (uint)sVar3 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar6 = sVar6 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
switchD_001d6816_default:
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

size_t Model::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Model)
  size_t total_size = 0;

  // .CoreML.Specification.ModelDescription description = 2;
  if (this->has_description()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->description_);
  }

  // int32 specificationVersion = 1;
  if (this->specificationversion() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::Int32Size(
        this->specificationversion());
  }

  // bool isUpdatable = 10;
  if (this->isupdatable() != 0) {
    total_size += 1 + 1;
  }

  switch (Type_case()) {
    // .CoreML.Specification.PipelineClassifier pipelineClassifier = 200;
    case kPipelineClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipelineclassifier_);
      break;
    }
    // .CoreML.Specification.PipelineRegressor pipelineRegressor = 201;
    case kPipelineRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipelineregressor_);
      break;
    }
    // .CoreML.Specification.Pipeline pipeline = 202;
    case kPipeline: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.pipeline_);
      break;
    }
    // .CoreML.Specification.GLMRegressor glmRegressor = 300;
    case kGlmRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.glmregressor_);
      break;
    }
    // .CoreML.Specification.SupportVectorRegressor supportVectorRegressor = 301;
    case kSupportVectorRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.supportvectorregressor_);
      break;
    }
    // .CoreML.Specification.TreeEnsembleRegressor treeEnsembleRegressor = 302;
    case kTreeEnsembleRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.treeensembleregressor_);
      break;
    }
    // .CoreML.Specification.NeuralNetworkRegressor neuralNetworkRegressor = 303;
    case kNeuralNetworkRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetworkregressor_);
      break;
    }
    // .CoreML.Specification.BayesianProbitRegressor bayesianProbitRegressor = 304;
    case kBayesianProbitRegressor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.bayesianprobitregressor_);
      break;
    }
    // .CoreML.Specification.GLMClassifier glmClassifier = 400;
    case kGlmClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.glmclassifier_);
      break;
    }
    // .CoreML.Specification.SupportVectorClassifier supportVectorClassifier = 401;
    case kSupportVectorClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.supportvectorclassifier_);
      break;
    }
    // .CoreML.Specification.TreeEnsembleClassifier treeEnsembleClassifier = 402;
    case kTreeEnsembleClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.treeensembleclassifier_);
      break;
    }
    // .CoreML.Specification.NeuralNetworkClassifier neuralNetworkClassifier = 403;
    case kNeuralNetworkClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetworkclassifier_);
      break;
    }
    // .CoreML.Specification.KNearestNeighborsClassifier kNearestNeighborsClassifier = 404;
    case kKNearestNeighborsClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.knearestneighborsclassifier_);
      break;
    }
    // .CoreML.Specification.NeuralNetwork neuralNetwork = 500;
    case kNeuralNetwork: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.neuralnetwork_);
      break;
    }
    // .CoreML.Specification.ItemSimilarityRecommender itemSimilarityRecommender = 501;
    case kItemSimilarityRecommender: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.itemsimilarityrecommender_);
      break;
    }
    // .CoreML.Specification.CustomModel customModel = 555;
    case kCustomModel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.custommodel_);
      break;
    }
    // .CoreML.Specification.LinkedModel linkedModel = 556;
    case kLinkedModel: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.linkedmodel_);
      break;
    }
    // .CoreML.Specification.OneHotEncoder oneHotEncoder = 600;
    case kOneHotEncoder: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.onehotencoder_);
      break;
    }
    // .CoreML.Specification.Imputer imputer = 601;
    case kImputer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.imputer_);
      break;
    }
    // .CoreML.Specification.FeatureVectorizer featureVectorizer = 602;
    case kFeatureVectorizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.featurevectorizer_);
      break;
    }
    // .CoreML.Specification.DictVectorizer dictVectorizer = 603;
    case kDictVectorizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.dictvectorizer_);
      break;
    }
    // .CoreML.Specification.Scaler scaler = 604;
    case kScaler: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.scaler_);
      break;
    }
    // .CoreML.Specification.CategoricalMapping categoricalMapping = 606;
    case kCategoricalMapping: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.categoricalmapping_);
      break;
    }
    // .CoreML.Specification.Normalizer normalizer = 607;
    case kNormalizer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.normalizer_);
      break;
    }
    // .CoreML.Specification.ArrayFeatureExtractor arrayFeatureExtractor = 609;
    case kArrayFeatureExtractor: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.arrayfeatureextractor_);
      break;
    }
    // .CoreML.Specification.NonMaximumSuppression nonMaximumSuppression = 610;
    case kNonMaximumSuppression: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.nonmaximumsuppression_);
      break;
    }
    // .CoreML.Specification.Identity identity = 900;
    case kIdentity: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.identity_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.TextClassifier textClassifier = 2000;
    case kTextClassifier: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.textclassifier_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.WordTagger wordTagger = 2001;
    case kWordTagger: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.wordtagger_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.VisionFeaturePrint visionFeaturePrint = 2002;
    case kVisionFeaturePrint: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.visionfeatureprint_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing soundAnalysisPreprocessing = 2003;
    case kSoundAnalysisPreprocessing: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.soundanalysispreprocessing_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.Gazetteer gazetteer = 2004;
    case kGazetteer: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.gazetteer_);
      break;
    }
    // .CoreML.Specification.CoreMLModels.WordEmbedding wordEmbedding = 2005;
    case kWordEmbedding: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.wordembedding_);
      break;
    }
    // .CoreML.Specification.SerializedModel serializedModel = 3000;
    case kSerializedModel: {
      total_size += 3 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *Type_.serializedmodel_);
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}